

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int s_mp_sqr(mp_int *a,mp_int *b)

{
  int size;
  uint uVar1;
  mp_digit *pmVar2;
  mp_digit mVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong *puVar19;
  mp_int t;
  mp_int t_1;
  
  uVar1 = a->used;
  size = uVar1 * 2 + 1;
  iVar10 = mp_init_size(&t,size);
  if (iVar10 == 0) {
    t.used = size;
    lVar15 = 0;
    uVar16 = 0;
    if (0 < (int)uVar1) {
      uVar16 = (ulong)uVar1;
    }
    for (uVar18 = 0; uVar18 != uVar16; uVar18 = uVar18 + 1) {
      pmVar2 = a->dp;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = pmVar2[uVar18];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pmVar2[uVar18];
      uVar11 = SUB168(auVar4 * auVar6,0);
      puVar19 = t.dp + uVar18 * 2;
      uVar12 = uVar11 + *puVar19;
      uVar11 = (SUB168(auVar4 * auVar6,8) + (ulong)CARRY8(uVar11,*puVar19)) * 0x10 | uVar12 >> 0x3c;
      *puVar19 = uVar12 & 0xfffffffffffffff;
      mVar3 = pmVar2[uVar18];
      for (lVar17 = 1; puVar19 = puVar19 + 1, (int)uVar18 + (int)lVar17 < (int)uVar1;
          lVar17 = lVar17 + 1) {
        uVar12 = *(ulong *)((long)pmVar2 + lVar17 * 8 + lVar15);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = mVar3 * 2;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar12;
        uVar13 = SUB168(auVar5 * auVar7,0);
        uVar14 = uVar11 + *puVar19 + uVar13;
        uVar11 = ((ulong)CARRY8(uVar11,*puVar19) +
                  SUB168(auVar5 * auVar7,8) + -((long)mVar3 >> 0x3f) * uVar12 +
                 (ulong)CARRY8(uVar11 + *puVar19,uVar13)) * 0x10 | uVar14 >> 0x3c;
        *puVar19 = uVar14 & 0xfffffffffffffff;
      }
      for (; uVar11 != 0; uVar11 = (ulong)CARRY8(uVar11,uVar12) << 4 | uVar11 + uVar13 >> 0x3c) {
        uVar12 = *puVar19;
        uVar13 = *puVar19;
        *puVar19 = uVar11 + uVar13 & 0xfffffffffffffff;
        puVar19 = puVar19 + 1;
      }
      lVar15 = lVar15 + 8;
    }
    mp_clamp(&t);
    pmVar2 = b->dp;
    uVar8._0_4_ = b->used;
    uVar8._4_4_ = b->alloc;
    uVar9._0_4_ = b->sign;
    uVar9._4_4_ = *(undefined4 *)&b->field_0xc;
    b->used = t.used;
    b->alloc = t.alloc;
    b->sign = t.sign;
    *(undefined4 *)&b->field_0xc = t._12_4_;
    b->dp = t.dp;
    t._0_8_ = uVar8;
    t._8_8_ = uVar9;
    t.dp = pmVar2;
    mp_clear(&t);
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int s_mp_sqr (mp_int * a, mp_int * b)
{
  mp_int  t;
  int     res, ix, iy, pa;
  mp_word r;
  mp_digit u, tmpx, *tmpt;

  pa = a->used;
  if ((res = mp_init_size (&t, 2*pa + 1)) != MP_OKAY) {
    return res;
  }

  /* default used is maximum possible size */
  t.used = 2*pa + 1;

  for (ix = 0; ix < pa; ix++) {
    /* first calculate the digit at 2*ix */
    /* calculate double precision result */
    r = ((mp_word) t.dp[2*ix]) +
        ((mp_word)a->dp[ix])*((mp_word)a->dp[ix]);

    /* store lower part in result */
    t.dp[ix+ix] = (mp_digit) (r & ((mp_word) MP_MASK));

    /* get the carry */
    u           = (mp_digit)(r >> ((mp_word) DIGIT_BIT));

    /* left hand side of A[ix] * A[iy] */
    tmpx        = a->dp[ix];

    /* alias for where to store the results */
    tmpt        = t.dp + (2*ix + 1);
    
    for (iy = ix + 1; iy < pa; iy++) {
      /* first calculate the product */
      r       = ((mp_word)tmpx) * ((mp_word)a->dp[iy]);

      /* now calculate the double precision result, note we use
       * addition instead of *2 since it's easier to optimize
       */
      r       = ((mp_word) *tmpt) + r + r + ((mp_word) u);

      /* store lower part */
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));

      /* get carry */
      u       = (mp_digit)(r >> ((mp_word) DIGIT_BIT));
    }
    /* propagate upwards */
    while (u != ((mp_digit) 0)) {
      r       = ((mp_word) *tmpt) + ((mp_word) u);
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));
      u       = (mp_digit)(r >> ((mp_word) DIGIT_BIT));
    }
  }

  mp_clamp (&t);
  mp_exch (&t, b);
  mp_clear (&t);
  return MP_OKAY;
}